

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  bool bVar1;
  uint uVar2;
  IStreamingReporter *pIVar3;
  SourceLineInfo *_lineInfo;
  TestCaseTracker *tracker;
  ostream *poVar4;
  undefined1 local_818 [8];
  SectionStats testCaseSectionStats;
  undefined1 local_778 [7];
  bool missingAssertions;
  Counts assertions;
  TestFailureException *anon_var_0;
  undefined1 local_4b8 [8];
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  Timer local_190;
  Timer timer;
  Guard guard;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  AssertionInfo local_130;
  double local_c0;
  double duration;
  Counts prevAssertions;
  undefined1 local_90 [8];
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  string *redirectedCerr_local;
  string *redirectedCout_local;
  RunContext *this_local;
  
  testCaseSection.lineInfo.line = (size_t)TestCase::getTestCaseInfo(this->m_activeTestCase);
  SectionInfo::SectionInfo
            ((SectionInfo *)local_90,&((TestCaseInfo *)testCaseSection.lineInfo.line)->lineInfo,
             (string *)testCaseSection.lineInfo.line,
             &((TestCaseInfo *)testCaseSection.lineInfo.line)->description);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar3,local_90);
  prevAssertions.failed = (this->m_totals).assertions.failedButOk;
  duration = (double)(this->m_totals).assertions.passed;
  prevAssertions.passed = (this->m_totals).assertions.failed;
  local_c0 = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"TEST_CASE",&local_151);
  _lineInfo = (SourceLineInfo *)(testCaseSection.lineInfo.line + 0xe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"",(allocator *)((long)&guard.m_tracker + 7));
  AssertionInfo::AssertionInfo(&local_130,(string *)local_150,_lineInfo,(string *)local_178,Normal);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,&local_130);
  AssertionInfo::~AssertionInfo(&local_130);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&guard.m_tracker + 7));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  tracker = Option<Catch::SectionTracking::TestCaseTracker>::operator*(&this->m_testCaseTracker);
  SectionTracking::TestCaseTracker::Guard::Guard((Guard *)&timer,tracker);
  Timer::Timer(&local_190);
  Timer::start(&local_190);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  uVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar2 & 1) == 0) {
    invokeActiveTestCase(this);
  }
  else {
    poVar4 = cout();
    StreamRedirect::StreamRedirect
              ((StreamRedirect *)&cerrRedir.m_targetString,poVar4,redirectedCout);
    poVar4 = cerr();
    StreamRedirect::StreamRedirect((StreamRedirect *)local_4b8,poVar4,redirectedCerr);
    invokeActiveTestCase(this);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_4b8);
    StreamRedirect::~StreamRedirect((StreamRedirect *)&cerrRedir.m_targetString);
  }
  local_c0 = Timer::getElapsedSeconds(&local_190);
  SectionTracking::TestCaseTracker::Guard::~Guard((Guard *)&timer);
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  Counts::operator-((Counts *)local_778,&(this->m_totals).assertions,(Counts *)&duration);
  testCaseSectionStats._151_1_ = testForMissingAssertions(this,(Counts *)local_778);
  bVar1 = TestCaseInfo::okToFail((TestCaseInfo *)testCaseSection.lineInfo.line);
  if (bVar1) {
    std::swap<unsigned_long>(&assertions.failed,&assertions.passed);
    (this->m_totals).assertions.failed = (this->m_totals).assertions.failed - assertions.failed;
    (this->m_totals).assertions.failedButOk =
         assertions.failed + (this->m_totals).assertions.failedButOk;
  }
  SectionStats::SectionStats
            ((SectionStats *)local_818,(SectionInfo *)local_90,(Counts *)local_778,local_c0,
             (bool)(testCaseSectionStats._151_1_ & 1));
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,local_818);
  SectionStats::~SectionStats((SectionStats *)local_818);
  SectionInfo::~SectionInfo((SectionInfo *)local_90);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                makeUnexpectedResultBuilder().useActiveException();
            }
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }